

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall
Graph::insertEdge(Graph *this,int originID,int destinyID,int id,double resist,double react,bool swit
                 )

{
  int iVar1;
  Vertex *vertex;
  Vertex *vertex_00;
  Edge *this_00;
  Edge *edge;
  Edge *newEdge;
  Vertex *destinyVertex;
  Vertex *originVertex;
  bool swit_local;
  double react_local;
  double resist_local;
  int id_local;
  int destinyID_local;
  int originID_local;
  Graph *this_local;
  
  vertex = findVertex(this,originID);
  vertex_00 = findVertex(this,destinyID);
  this_00 = (Edge *)operator_new(0x60);
  Edge::Edge(this_00,id);
  Edge::setDestiny(this_00,vertex_00);
  Edge::setOrigin(this_00,vertex);
  edge = Vertex::getEdgesList(vertex);
  Edge::setNext(this_00,edge);
  Vertex::setEdgesList(vertex,this_00);
  Edge::setResistance(this_00,resist);
  Edge::setReactance(this_00,react);
  Edge::setSwitch(this_00,swit);
  iVar1 = Vertex::getIndegree(vertex);
  Vertex::setOutdegree(vertex,iVar1 + 1);
  iVar1 = Vertex::getOutdegree(vertex_00);
  Vertex::setIndegree(vertex_00,iVar1 + 1);
  this->edgesSize = this->edgesSize + 1;
  return;
}

Assistant:

void Graph::insertEdge(int originID, int destinyID, int id, double resist, double react, bool swit){
    Vertex *originVertex = findVertex(originID);
    Vertex *destinyVertex = findVertex(destinyID);
    Edge *newEdge = new Edge(id);
    newEdge->setDestiny(destinyVertex);
    newEdge->setOrigin(originVertex);

    // Insere Arco no inicio da lista
    newEdge->setNext(originVertex->getEdgesList());
    originVertex->setEdgesList(newEdge);
    newEdge->setResistance(resist);
    newEdge->setReactance(react);
    newEdge->setSwitch(swit);

    originVertex->setOutdegree(originVertex->getIndegree() + 1);
    destinyVertex->setIndegree(destinyVertex->getOutdegree() + 1);

    this->edgesSize++;
}